

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# findstr.cpp
# Opt level: O1

char * __thiscall regexsearcher::search(regexsearcher *this,char *first,char *last,CallbackType *cb)

{
  bool bVar1;
  const_reference pvVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  regex_iterator<const_char_*,_char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_> b;
  regex_iterator<const_char_*,_char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_> a;
  shared_count sStack_60;
  regex_iterator<const_char_*,_char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>
  local_58;
  char *local_48;
  char *local_40;
  char *local_38;
  
  local_48 = last;
  boost::
  regex_iterator<const_char_*,_char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>::
  regex_iterator(&local_58,first,last,&this->re,match_partial);
  sStack_60.pi_ = (sp_counted_base *)0x0;
  pcVar4 = (char *)0x0;
  pcVar5 = (char *)0x0;
  do {
    if (local_58.pdata.px == (element_type *)0x0) {
      pcVar6 = pcVar4;
      if (pcVar4 < pcVar5) {
        pcVar6 = local_48;
      }
      if (pcVar5 == (char *)0x0 && pcVar4 == (char *)0x0) {
        pcVar6 = local_48;
      }
      goto LAB_0010f839;
    }
    if (local_58.pdata.px == (element_type *)0x0) {
      __assert_fail("px != 0","/usr/include/boost/smart_ptr/shared_ptr.hpp",0x2d8,
                    "typename boost::detail::sp_member_access<T>::type boost::shared_ptr<boost::regex_iterator_implementation<const char *, char, boost::regex_traits<char>>>::operator->() const [T = boost::regex_iterator_implementation<const char *, char, boost::regex_traits<char>>]"
                   );
    }
    pvVar2 = boost::match_results<const_char_*,_std::allocator<boost::sub_match<const_char_*>_>_>::
             operator[](&(local_58.pdata.px)->what,0);
    pcVar6 = (pvVar2->super_pair<const_char_*,_const_char_*>).first;
    if (pvVar2->matched == true) {
      local_40 = (pvVar2->super_pair<const_char_*,_const_char_*>).second;
      local_38 = pcVar6;
      if ((cb->super__Function_base)._M_manager == (_Manager_type)0x0) {
        std::__throw_bad_function_call();
      }
      bVar1 = (*cb->_M_invoker)((_Any_data *)cb,&local_38,&local_40);
      if (bVar1) {
        pcVar3 = pcVar5;
        if (pcVar5 < pcVar6) {
          pcVar3 = pcVar6;
        }
        bVar1 = pcVar5 == (char *)0x0;
        pcVar5 = pcVar3;
        if (bVar1) {
          pcVar5 = pcVar6;
        }
        goto LAB_0010f805;
      }
      bVar1 = false;
    }
    else {
      pcVar3 = pcVar4;
      if (pcVar4 < pcVar6) {
        pcVar3 = pcVar6;
      }
      bVar1 = pcVar4 == (char *)0x0;
      pcVar4 = pcVar3;
      if (bVar1) {
        pcVar4 = pcVar6;
      }
LAB_0010f805:
      bVar1 = true;
      boost::
      regex_iterator<const_char_*,_char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>
      ::operator++(&local_58);
    }
  } while (bVar1);
  pcVar6 = (char *)0x0;
LAB_0010f839:
  boost::detail::shared_count::~shared_count(&sStack_60);
  boost::detail::shared_count::~shared_count(&local_58.pdata.pn);
  return pcVar6;
}

Assistant:

const char *search(const char *first, const char *last, CallbackType cb)
    {
        REGEX_ITER<const char*> a(first, last, re   PARTIALARG);
        REGEX_ITER<const char*> b;

        const char *maxpartial = NULL;
        const char *maxmatch = NULL;

        //printf("searchrange(%p, %p)\n", first, last);
        while (a != b) {
            auto m = (*a)[0];
            //printf("    match %d  %p..%p\n", m.matched, m.first, m.second);
            if (m.matched) {
                if (!cb(m.first, m.second)) {
                    //printf("searchrange: stopping\n");
                    return NULL;
                }
                if (maxmatch == NULL || maxmatch < m.first)
                    maxmatch = m.first;
            }
            else {
                if (maxpartial == NULL || maxpartial < m.first)
                    maxpartial = m.first;
            }

            ++a;
        }
        if ((maxmatch == NULL && maxpartial == NULL) || maxmatch > maxpartial) {
            //printf("searchrange: no partial match\n");
            return last;
        }

        //printf("searchrange: partial match @%lx\n", maxpartial-first);
        return maxpartial;
    }